

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftwareRenderer.hpp
# Opt level: O3

Image4u * __thiscall
eos::render::SoftwareRenderer<eos::render::VertexShader,_eos::render::VertexColoringFragmentShader>
::render<float>(Image4u *__return_storage_ptr__,
               SoftwareRenderer<eos::render::VertexShader,_eos::render::VertexColoringFragmentShader>
               *this,Mesh *mesh,Matrix4<float> *model_view_matrix,Matrix4<float> *projection_matrix,
               optional<eos::render::Texture> *texture)

{
  pointer paVar1;
  DenseStorage<float,_2,_2,_1,_0> *pDVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  pointer pMVar12;
  pointer pMVar13;
  pointer pMVar14;
  pointer pMVar15;
  pointer pMVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  pointer pVVar25;
  pointer pVVar26;
  Mesh *pMVar27;
  Vertex<float> *pVVar28;
  optional<eos::render::Texture> *texture_00;
  Image4u *pIVar29;
  pointer paVar30;
  ulong uVar31;
  pointer paVar32;
  Matrix<float,_3,_1,_0,_3,_1> *vertex_position;
  pointer pMVar33;
  ulong uVar34;
  undefined1 point_a [8];
  float afVar35 [2];
  long lVar36;
  byte bVar37;
  byte bVar38;
  long lVar39;
  byte bVar40;
  byte bVar41;
  long lVar42;
  Mesh *pMVar43;
  float fVar44;
  Rect<int> RVar45;
  uchar visibility_bits [3];
  vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
  triangles_to_raster;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  clipspace_vertices;
  byte local_1df [3];
  float local_1dc;
  vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
  local_1d8;
  Mesh *local_1c0;
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  long local_1a8;
  void *local_198;
  iterator iStack_190;
  Matrix<float,_4,_1,_0,_4,_1> *local_188;
  undefined1 local_178 [8];
  float afStack_170 [2];
  pointer local_168;
  float local_160;
  DenseStorage<float,_2,_2,_1,_0> local_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138 [3];
  DenseStorage<float,_2,_2,_1,_0> local_12c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108 [3];
  DenseStorage<float,_2,_2,_1,_0> local_fc;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  Vector4<float> local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [8];
  float fStack_a0;
  DenseStorage<float,_2,_2,_1,_0> local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  optional<eos::render::Texture> *local_58;
  Image4u *local_50;
  pointer local_48;
  pointer local_40;
  DenseStorage<float,_2,_2,_1,_0> local_38;
  
  uStack_d0 = local_d8;
  local_d8 = (undefined1  [8])projection_matrix;
  pMVar33 = (mesh->vertices).
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pMVar12 = (mesh->vertices).
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pMVar13 = (mesh->colors).
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pMVar14 = (mesh->colors).
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_e8 = model_view_matrix;
  if ((long)pMVar12 - (long)pMVar33 != (long)pMVar13 - (long)pMVar14 && pMVar13 != pMVar14) {
    __assert_fail("mesh.vertices.size() == mesh.colors.size() || mesh.colors.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/SoftwareRenderer.hpp"
                  ,0x68,
                  "core::Image4u eos::render::SoftwareRenderer<eos::render::VertexShader, eos::render::VertexColoringFragmentShader>::render(const core::Mesh &, const Eigen::Matrix4<T> &, const Eigen::Matrix4<T> &, const cpp17::optional<Texture> &) [VertexShaderType = eos::render::VertexShader, FragmentShaderType = eos::render::VertexColoringFragmentShader, T = float]"
                 );
  }
  pMVar15 = (mesh->texcoords).
            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pMVar16 = (mesh->texcoords).
            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  paVar32 = (mesh->tti).
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_start;
  paVar30 = (mesh->tti).
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_finish;
  local_1c0 = mesh;
  if ((((long)pMVar12 - (long)pMVar33 >> 2) * -0x5555555555555555 -
       ((long)pMVar16 - (long)pMVar15 >> 3) != 0) && (pMVar15 != pMVar16 && paVar32 == paVar30)) {
    __assert_fail("mesh.vertices.size() == mesh.texcoords.size() || ((mesh.vertices.size() != mesh.texcoords.size()) && !mesh.tti.empty()) || mesh.texcoords.empty()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/SoftwareRenderer.hpp"
                  ,0x70,
                  "core::Image4u eos::render::SoftwareRenderer<eos::render::VertexShader, eos::render::VertexColoringFragmentShader>::render(const core::Mesh &, const Eigen::Matrix4<T> &, const Eigen::Matrix4<T> &, const cpp17::optional<Texture> &) [VertexShaderType = eos::render::VertexShader, FragmentShaderType = eos::render::VertexColoringFragmentShader, T = float]"
                 );
  }
  if ((paVar32 != paVar30) &&
     ((long)paVar30 - (long)paVar32 !=
      (long)(mesh->tvi).
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)(mesh->tvi).
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_start)) {
    __assert_fail("mesh.tti.empty() || mesh.tti.size() == mesh.tvi.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/SoftwareRenderer.hpp"
                  ,0x72,
                  "core::Image4u eos::render::SoftwareRenderer<eos::render::VertexShader, eos::render::VertexColoringFragmentShader>::render(const core::Mesh &, const Eigen::Matrix4<T> &, const Eigen::Matrix4<T> &, const cpp17::optional<Texture> &) [VertexShaderType = eos::render::VertexShader, FragmentShaderType = eos::render::VertexColoringFragmentShader, T = float]"
                 );
  }
  local_50 = __return_storage_ptr__;
  if ((pMVar16 == pMVar15) &&
     ((texture->super__Optional_base<eos::render::Texture,_false,_false>)._M_payload.
      super__Optional_payload<eos::render::Texture,_true,_false,_false>.
      super__Optional_payload_base<eos::render::Texture>._M_engaged != false)) {
    __assert_fail("!texture.has_value() || (texture.has_value() && mesh.texcoords.size() > 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/SoftwareRenderer.hpp"
                  ,0x75,
                  "core::Image4u eos::render::SoftwareRenderer<eos::render::VertexShader, eos::render::VertexColoringFragmentShader>::render(const core::Mesh &, const Eigen::Matrix4<T> &, const Eigen::Matrix4<T> &, const cpp17::optional<Texture> &) [VertexShaderType = eos::render::VertexShader, FragmentShaderType = eos::render::VertexColoringFragmentShader, T = float]"
                 );
  }
  local_198 = (void *)0x0;
  iStack_190._M_current = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
  local_188 = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
  local_58 = texture;
  if (pMVar33 != pMVar12) {
    do {
      local_1b8 = *(undefined1 (*) [8])
                   (pMVar33->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data.array;
      uStack_1b0._4_4_ = 1.0;
      uStack_1b0._0_4_ =
           (pMVar33->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2];
      VertexShader::operator()
                ((VertexShader *)&this->field_0x90,(Vector4<float> *)local_1b8,local_e8,
                 (Matrix4<float> *)local_d8);
      if (iStack_190._M_current == local_188) {
        std::vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>::
        _M_realloc_insert<Eigen::Matrix<float,4,1,0,4,1>>
                  ((vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>
                    *)&local_198,iStack_190,(Matrix<float,_4,_1,_0,_4,_1> *)local_178);
      }
      else {
        *(undefined1 (*) [8])
         ((iStack_190._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
         m_storage.m_data.array = local_178;
        *(float (*) [2])
         (((iStack_190._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
          m_storage.m_data.array + 2) = afStack_170;
        iStack_190._M_current = iStack_190._M_current + 1;
      }
      pMVar33 = pMVar33 + 1;
    } while (pMVar33 != pMVar12);
    paVar32 = (local_1c0->tti).
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  local_1b8 = (undefined1  [8])0x0;
  uStack_1b0 = (Vertex<float> *)0x0;
  local_1a8 = 0;
  paVar30 = (local_1c0->tvi).
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((local_1c0->tvi).
      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish != paVar30) {
    local_48 = (local_1c0->tti).
               super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    lVar39 = 0;
    uVar34 = 0;
    pMVar43 = local_1c0;
    local_40 = paVar32;
    do {
      pMVar27 = local_1c0;
      paVar32 = paVar30;
      if (local_40 != local_48) {
        paVar32 = (pMVar43->tti).
                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      paVar1 = paVar30 + uVar34;
      bVar8 = this->enable_near_clipping;
      bVar9 = (this->rasterizer).enable_far_clipping;
      lVar36 = 0;
      do {
        local_1df[lVar36] = 0;
        lVar42 = (long)*(int *)((long)paVar30->_M_elems + lVar36 * 4 + lVar39) * 0x10;
        fVar3 = *(float *)((long)local_198 + lVar42 + 8);
        fVar4 = *(float *)((long)local_198 + lVar42 + 0xc);
        fVar44 = -fVar4;
        fVar5 = *(float *)((long)local_198 + lVar42);
        bVar38 = fVar3 < fVar44 & bVar8;
        fVar6 = *(float *)((long)local_198 + lVar42 + 4);
        bVar37 = fVar4 < fVar3 & bVar9;
        if (((((fVar5 < fVar44) || (fVar4 < fVar5)) || (fVar6 < fVar44)) ||
            ((fVar4 < fVar6 || (bVar38 != 0)))) || (bVar37 != 0)) {
          bVar40 = (fVar5 < fVar44) + 2;
          if (fVar5 <= fVar4) {
            bVar40 = fVar5 < fVar44;
          }
          bVar41 = bVar40 + 4;
          if (fVar44 <= fVar6) {
            bVar41 = bVar40;
          }
          bVar40 = bVar41 | 8;
          if (fVar6 <= fVar4) {
            bVar40 = bVar41;
          }
          bVar41 = bVar40 | 0x10;
          if (bVar38 == 0) {
            bVar41 = bVar40;
          }
          bVar38 = bVar41 | 0x20;
          if (bVar37 == 0) {
            bVar38 = bVar41;
          }
          local_1df[lVar36] = bVar38;
        }
        lVar36 = lVar36 + 1;
      } while (lVar36 != 3);
      pMVar43 = pMVar27;
      if ((local_1df[1] & local_1df[0] & local_1df[2]) == 0) {
        paVar32 = paVar32 + uVar34;
        if ((local_1df[1] == 0 && local_1df[0] == 0) && local_1df[2] == 0) {
          lVar36 = (long)paVar1->_M_elems[0] * 0x10;
          fVar3 = *(float *)((long)local_198 + lVar36 + 0xc);
          local_98.m_data.array[0] = fVar3;
          auVar20._4_4_ = fVar3;
          auVar20._0_4_ = fVar3;
          auVar20._8_4_ = fVar3;
          auVar20._12_4_ = fVar3;
          _local_a8 = divps(*(undefined1 (*) [16])((long)local_198 + lVar36),auVar20);
          lVar36 = (long)paVar1->_M_elems[1] * 0x10;
          local_1dc = *(float *)((long)local_198 + lVar36 + 0xc);
          auVar21._4_4_ = local_1dc;
          auVar21._0_4_ = local_1dc;
          auVar21._8_4_ = local_1dc;
          auVar21._12_4_ = local_1dc;
          local_78 = divps(*(undefined1 (*) [16])((long)local_198 + lVar36),auVar21);
          lVar36 = (long)paVar1->_M_elems[2] * 0x10;
          local_178 = (undefined1  [8])((long)local_198 + lVar36);
          afStack_170[1] = *(float *)((long)local_198 + lVar36 + 0xc);
          local_b8 = CONCAT44(local_b8._4_4_,afStack_170[1]);
          iVar10 = (this->rasterizer).viewport_width;
          iVar11 = (this->rasterizer).viewport_height;
          fVar4 = (float)iVar10 * 0.5;
          fVar3 = (local_a8._0_4_ + 1.0) * fVar4;
          fVar44 = (float)iVar11;
          fVar24 = fVar44 * 0.5;
          fVar6 = fVar44 - (local_a8._4_4_ + 1.0) * fVar24;
          fVar23 = fVar44 - (local_78._4_4_ + 1.0) * fVar24;
          fVar5 = (local_78._0_4_ + 1.0) * fVar4;
          auVar22._4_4_ = afStack_170[1];
          auVar22._0_4_ = afStack_170[1];
          auVar22._8_4_ = afStack_170[1];
          auVar22._12_4_ = afStack_170[1];
          local_88 = divps(*(undefined1 (*) [16])((long)local_198 + lVar36),auVar22);
          fVar4 = (local_88._0_4_ + 1.0) * fVar4;
          fVar44 = fVar44 - (local_88._4_4_ + 1.0) * fVar24;
          if ((this->enable_backface_culling != true) ||
             ((fVar44 - fVar6) * (fVar5 - fVar3) - (fVar4 - fVar3) * (fVar23 - fVar6) < 0.0)) {
            local_68._4_4_ = fVar6;
            local_68._0_4_ = fVar3;
            local_68._8_8_ = 0;
            local_178._4_4_ = fVar6;
            local_178._0_4_ = fVar3;
            local_e8 = (Matrix4<float> *)CONCAT44(fVar23,fVar5);
            uStack_e0 = 0;
            local_1d8.
            super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
            ._M_impl.super__Vector_impl_data._M_start._4_4_ = fVar23;
            local_1d8.
            super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = fVar5;
            local_d8._4_4_ = fVar44;
            local_d8._0_4_ = fVar4;
            uStack_d0 = 0;
            local_c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[1] = fVar44;
            local_c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[0] = fVar4;
            RVar45 = detail::calculate_clipped_bounding_box<float>
                               ((Vector2<float> *)local_178,(Vector2<float> *)&local_1d8,
                                (Vector2<float> *)&local_c8,iVar10,iVar11);
            if (0 < RVar45.width && (RVar45.height != 0 && -1 < RVar45._8_8_)) {
              local_178 = local_68._0_8_;
              afStack_170[1] = 1.0 / local_98.m_data.array[0];
              afStack_170[0] = fStack_a0;
              pMVar33 = (pMVar27->colors).
                        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pMVar12 = (pMVar27->colors).
                        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (pMVar12 == pMVar33) {
                local_168 = (pointer)0x0;
                local_160 = 0.0;
              }
              else {
                local_160 = pMVar33[paVar1->_M_elems[0]].
                            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array[2];
                local_168 = *(pointer *)
                             pMVar33[paVar1->_M_elems[0]].
                             super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array;
              }
              fStack_13c = 1.0 / local_1dc;
              fStack_10c = 1.0 / (float)local_b8;
              pMVar15 = (pMVar27->texcoords).
                        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_15c.m_data.array[1] =
                   *(float *)((long)&pMVar15[paVar32->_M_elems[0]].
                                     super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                     m_storage.m_data + 4);
              local_15c.m_data.array[0] =
                   pMVar15[paVar32->_M_elems[0]].
                   super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                   array[0];
              local_148 = (float)local_e8;
              fStack_144 = local_e8._4_4_;
              fStack_140 = (float)local_78._8_4_;
              if (pMVar12 == pMVar33) {
                local_138[0] = 0.0;
                local_138[1] = 0.0;
                local_138[2] = 0.0;
                local_12c.m_data.array[1] =
                     *(float *)((long)&pMVar15[paVar32->_M_elems[1]].
                                       super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                       m_storage.m_data + 4);
                local_12c.m_data.array[0] =
                     pMVar15[paVar32->_M_elems[1]].
                     super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                     array[0];
                local_108[0] = 0.0;
                local_108[1] = 0.0;
                local_108[2] = 0.0;
              }
              else {
                local_138[2] = pMVar33[paVar1->_M_elems[1]].
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                               .m_data.array[2];
                local_138._0_8_ =
                     *(undefined8 *)
                      pMVar33[paVar1->_M_elems[1]].
                      super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array;
                local_12c.m_data.array[1] =
                     *(float *)((long)&pMVar15[paVar32->_M_elems[1]].
                                       super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                       m_storage.m_data + 4);
                local_12c.m_data.array[0] =
                     pMVar15[paVar32->_M_elems[1]].
                     super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                     array[0];
                local_108[2] = pMVar33[paVar1->_M_elems[2]].
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage
                               .m_data.array[2];
                local_108._0_8_ =
                     *(undefined8 *)
                      pMVar33[paVar1->_M_elems[2]].
                      super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array;
              }
              fStack_110 = (float)local_88._8_4_;
              fStack_114 = (float)local_d8._4_4_;
              local_118 = (float)local_d8._0_4_;
              local_fc.m_data.array[1] =
                   *(float *)((long)&pMVar15[paVar32->_M_elems[2]].
                                     super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                     m_storage.m_data + 4);
              local_fc.m_data.array[0] =
                   pMVar15[paVar32->_M_elems[2]].
                   super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                   array[0];
              std::
              vector<std::array<eos::render::detail::Vertex<float>,3ul>,std::allocator<std::array<eos::render::detail::Vertex<float>,3ul>>>
              ::emplace_back<std::array<eos::render::detail::Vertex<float>,3ul>>
                        ((vector<std::array<eos::render::detail::Vertex<float>,3ul>,std::allocator<std::array<eos::render::detail::Vertex<float>,3ul>>>
                          *)local_1b8,(array<eos::render::detail::Vertex<float>,_3UL> *)local_178);
            }
          }
        }
        else {
          local_1d8.
          super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1d8.
          super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1d8.
          super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
          ::reserve(&local_1d8,3);
          pDVar2 = (DenseStorage<float,_2,_2,_1,_0> *)
                   ((long)local_198 + (long)paVar1->_M_elems[0] * 0x10);
          local_178 = *(undefined1 (*) [8])&pDVar2->m_data;
          afStack_170 = *&pDVar2[1].m_data.array;
          pMVar33 = (pMVar27->colors).
                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pMVar27->colors).
              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish == pMVar33) {
            local_168 = (pointer)0x0;
            local_160 = 0.0;
          }
          else {
            local_160 = pMVar33[paVar1->_M_elems[0]].
                        super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
                        .array[2];
            local_168 = *(pointer *)
                         pMVar33[paVar1->_M_elems[0]].
                         super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array;
          }
          pMVar15 = (pMVar27->texcoords).
                    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_15c.m_data.array[1] =
               *(float *)((long)&pMVar15[paVar32->_M_elems[0]].
                                 super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                 m_storage.m_data + 4);
          local_15c.m_data.array[0] =
               pMVar15[paVar32->_M_elems[0]].
               super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
          ;
          std::
          vector<eos::render::detail::Vertex<float>,std::allocator<eos::render::detail::Vertex<float>>>
          ::emplace_back<eos::render::detail::Vertex<float>>
                    ((vector<eos::render::detail::Vertex<float>,std::allocator<eos::render::detail::Vertex<float>>>
                      *)&local_1d8,(Vertex<float> *)local_178);
          pDVar2 = (DenseStorage<float,_2,_2,_1,_0> *)
                   ((long)local_198 + (long)paVar1->_M_elems[1] * 0x10);
          local_178 = *(undefined1 (*) [8])&pDVar2->m_data;
          afStack_170 = *&pDVar2[1].m_data.array;
          pMVar33 = (pMVar27->colors).
                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pMVar27->colors).
              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish == pMVar33) {
            local_168 = (pointer)0x0;
            local_160 = 0.0;
          }
          else {
            local_160 = pMVar33[paVar1->_M_elems[1]].
                        super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
                        .array[2];
            local_168 = *(pointer *)
                         pMVar33[paVar1->_M_elems[1]].
                         super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array;
          }
          pMVar15 = (pMVar27->texcoords).
                    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_15c.m_data.array[1] =
               *(float *)((long)&pMVar15[paVar32->_M_elems[1]].
                                 super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                 m_storage.m_data + 4);
          local_15c.m_data.array[0] =
               pMVar15[paVar32->_M_elems[1]].
               super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
          ;
          std::
          vector<eos::render::detail::Vertex<float>,std::allocator<eos::render::detail::Vertex<float>>>
          ::emplace_back<eos::render::detail::Vertex<float>>
                    ((vector<eos::render::detail::Vertex<float>,std::allocator<eos::render::detail::Vertex<float>>>
                      *)&local_1d8,(Vertex<float> *)local_178);
          pDVar2 = (DenseStorage<float,_2,_2,_1,_0> *)
                   ((long)local_198 + (long)paVar1->_M_elems[2] * 0x10);
          local_178 = *(undefined1 (*) [8])&pDVar2->m_data;
          afStack_170 = *&pDVar2[1].m_data.array;
          pMVar33 = (pMVar27->colors).
                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pMVar27->colors).
              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish == pMVar33) {
            local_168 = (pointer)0x0;
            local_160 = 0.0;
          }
          else {
            local_160 = pMVar33[paVar1->_M_elems[2]].
                        super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
                        .array[2];
            local_168 = *(pointer *)
                         pMVar33[paVar1->_M_elems[2]].
                         super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array;
          }
          pMVar15 = (pMVar27->texcoords).
                    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_15c.m_data.array[1] =
               *(float *)((long)&pMVar15[paVar32->_M_elems[2]].
                                 super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                 m_storage.m_data + 4);
          local_15c.m_data.array[0] =
               pMVar15[paVar32->_M_elems[2]].
               super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
          ;
          std::
          vector<eos::render::detail::Vertex<float>,std::allocator<eos::render::detail::Vertex<float>>>
          ::emplace_back<eos::render::detail::Vertex<float>>
                    ((vector<eos::render::detail::Vertex<float>,std::allocator<eos::render::detail::Vertex<float>>>
                      *)&local_1d8,(Vertex<float> *)local_178);
          if (this->enable_near_clipping == true) {
            local_c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[0] = 0.0;
            local_c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[1] = 0.0;
            local_c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[2] = -1.0;
            local_c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[3] = -1.0;
            detail::clip_polygon_to_plane_in_4d
                      ((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                        *)local_178,&local_1d8,&local_c8);
            pVVar26 = local_1d8.
                      super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pVVar25 = local_1d8.
                      super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_1d8.
            super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_178;
            local_1d8.
            super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)afStack_170;
            local_1d8.
            super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = local_168;
            local_178 = (undefined1  [8])0x0;
            afStack_170[0] = 0.0;
            afStack_170[1] = 0.0;
            local_168 = (pointer)0x0;
            if (((float  [2])pVVar25 != (float  [2])0x0) &&
               (operator_delete(pVVar25,(long)pVVar26 - (long)pVVar25),
               (float  [2])local_178 != (float  [2])0x0)) {
              operator_delete((void *)local_178,(long)local_168 - (long)local_178);
            }
          }
          afVar35 = (float  [2])
                    local_1d8.
                    super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (2 < (ulong)(((long)local_1d8.
                                 super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_1d8.
                                 super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4) *
                         -0x5555555555555555)) {
            bVar37 = 0;
            do {
              fVar3 = *(float *)((long)afVar35 + 0xc);
              local_e8 = (Matrix4<float> *)CONCAT44(local_e8._4_4_,fVar3);
              auVar17._4_4_ = fVar3;
              auVar17._0_4_ = fVar3;
              auVar17._8_4_ = fVar3;
              auVar17._12_4_ = fVar3;
              _local_d8 = divps(*(undefined1 (*) [16])afVar35,auVar17);
              uVar31 = (ulong)((bVar37 + 1) * 0x30);
              uVar7 = *(undefined4 *)((long)((long)afVar35 + 0xc) + uVar31);
              local_78._0_4_ = uVar7;
              auVar18._4_4_ = uVar7;
              auVar18._0_4_ = uVar7;
              auVar18._8_4_ = uVar7;
              auVar18._12_4_ = uVar7;
              local_68 = divps(*(undefined1 (*) [16])((long)afVar35 + uVar31),auVar18);
              uVar31 = (ulong)((bVar37 + 2) * 0x30);
              local_178 = (undefined1  [8])((long)afVar35 + uVar31);
              local_1dc = *(float *)((long)((long)afVar35 + 0xc) + uVar31);
              afStack_170[1] = local_1dc;
              iVar10 = (this->rasterizer).viewport_width;
              iVar11 = (this->rasterizer).viewport_height;
              fVar4 = (float)iVar10 * 0.5;
              fVar3 = (local_d8._0_4_ + 1.0) * fVar4;
              fVar44 = (float)iVar11;
              fVar24 = fVar44 * 0.5;
              fVar6 = fVar44 - (local_d8._4_4_ + 1.0) * fVar24;
              fVar23 = fVar44 - (local_68._4_4_ + 1.0) * fVar24;
              fVar5 = (local_68._0_4_ + 1.0) * fVar4;
              auVar19._4_4_ = local_1dc;
              auVar19._0_4_ = local_1dc;
              auVar19._8_4_ = local_1dc;
              auVar19._12_4_ = local_1dc;
              local_88 = divps(*(undefined1 (*) [16])((long)afVar35 + uVar31),auVar19);
              fVar4 = (local_88._0_4_ + 1.0) * fVar4;
              fVar44 = fVar44 - (local_88._4_4_ + 1.0) * fVar24;
              if ((this->enable_backface_culling != true) ||
                 ((fVar44 - fVar6) * (fVar5 - fVar3) - (fVar4 - fVar3) * (fVar23 - fVar6) < 0.0)) {
                local_98.m_data.array[1] = fVar6;
                local_98.m_data.array[0] = fVar3;
                uStack_90 = 0;
                local_178._4_4_ = fVar6;
                local_178._0_4_ = fVar3;
                local_a8._4_4_ = fVar23;
                local_a8._0_4_ = fVar5;
                _fStack_a0 = 0;
                local_c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                m_data.array[1] = fVar23;
                local_c8.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                m_data.array[0] = fVar5;
                local_b8 = CONCAT44(fVar44,fVar4);
                uStack_b0 = 0;
                local_38.m_data.array[1] = fVar44;
                local_38.m_data.array[0] = fVar4;
                RVar45 = detail::calculate_clipped_bounding_box<float>
                                   ((Vector2<float> *)local_178,(Vector2<float> *)&local_c8,
                                    (Vector2<float> *)&local_38,iVar10,iVar11);
                afVar35 = (float  [2])
                          local_1d8.
                          super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (0 < RVar45.width && (RVar45.height != 0 && -1 < RVar45._8_8_)) {
                  fStack_13c = 1.0 / (float)local_78._0_4_;
                  fStack_10c = 1.0 / local_1dc;
                  local_178 = (undefined1  [8])local_98.m_data.array;
                  afStack_170[1] = 1.0 / (float)local_e8;
                  afStack_170[0] = (float)uStack_d0;
                  local_160 = *(float *)((long)local_1d8.
                                               super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start + 0x18);
                  local_168 = *(pointer *)
                               (((Vector3<float> *)
                                ((long)local_1d8.
                                       super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 0x10))->
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                               m_storage.m_data.array;
                  local_15c.m_data.array =
                       *(plain_array<float,_2,_0,_0> *)
                        (((Vector2<float> *)
                         ((long)local_1d8.
                                super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 0x1c))->
                        super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage.
                        m_data.array;
                  local_148 = (float)local_a8._0_4_;
                  fStack_144 = (float)local_a8._4_4_;
                  fStack_140 = (float)local_68._8_4_;
                  uVar31 = (ulong)((bVar37 + 1) * 0x30);
                  local_138[2] = *(float *)((long)((long)local_1d8.
                                                                                                                  
                                                  super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 0x18)
                                           + uVar31);
                  local_138._0_8_ =
                       *(undefined8 *)
                        ((long)(((Vector3<float> *)
                                ((long)local_1d8.
                                       super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 0x10))->
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                               m_storage.m_data.array + uVar31);
                  local_12c.m_data.array =
                       ((DenseStorage<float,_2,_2,_1,_0> *)
                       ((long)(((Vector2<float> *)
                               ((long)local_1d8.
                                      super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 0x1c))->
                              super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage
                              .m_data.array + uVar31))->m_data;
                  local_118 = (float)local_b8;
                  fStack_114 = local_b8._4_4_;
                  fStack_110 = (float)local_88._8_4_;
                  uVar31 = (ulong)((bVar37 + 2) * 0x30);
                  local_108[2] = *(float *)((long)((long)local_1d8.
                                                                                                                  
                                                  super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 0x18)
                                           + uVar31);
                  local_108._0_8_ =
                       *(undefined8 *)
                        ((long)(((Vector3<float> *)
                                ((long)local_1d8.
                                       super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 0x10))->
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                               m_storage.m_data.array + uVar31);
                  local_fc.m_data.array =
                       ((DenseStorage<float,_2,_2,_1,_0> *)
                       ((long)(((Vector2<float> *)
                               ((long)local_1d8.
                                      super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 0x1c))->
                              super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage
                              .m_data.array + uVar31))->m_data;
                  std::
                  vector<std::array<eos::render::detail::Vertex<float>,3ul>,std::allocator<std::array<eos::render::detail::Vertex<float>,3ul>>>
                  ::emplace_back<std::array<eos::render::detail::Vertex<float>,3ul>>
                            ((vector<std::array<eos::render::detail::Vertex<float>,3ul>,std::allocator<std::array<eos::render::detail::Vertex<float>,3ul>>>
                              *)local_1b8,
                             (array<eos::render::detail::Vertex<float>,_3UL> *)local_178);
                  afVar35 = (float  [2])
                            local_1d8.
                            super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                }
              }
              bVar37 = bVar37 + 1;
            } while ((ulong)bVar37 <
                     ((long)local_1d8.
                            super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)afVar35 >> 4) *
                     -0x5555555555555555 - 2U);
          }
          pMVar43 = local_1c0;
          if (afVar35 != (float  [2])0x0) {
            operator_delete((void *)afVar35,
                            (long)local_1d8.
                                  super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)afVar35
                           );
            pMVar43 = local_1c0;
          }
        }
      }
      texture_00 = local_58;
      pVVar28 = uStack_1b0;
      uVar34 = uVar34 + 1;
      paVar30 = (pMVar43->tvi).
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar39 = lVar39 + 0xc;
    } while (uVar34 < (ulong)(((long)(pMVar43->tvi).
                                     super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)paVar30 >> 2
                              ) * -0x5555555555555555));
    if (local_1b8 != (undefined1  [8])uStack_1b0) {
      point_a = local_1b8;
      do {
        Rasterizer<eos::render::VertexColoringFragmentShader>::raster_triangle<float>
                  (&this->rasterizer,(Vertex<float> *)point_a,
                   (Vertex<float> *)((long)point_a + 0x30),(Vertex<float> *)((long)point_a + 0x60),
                   texture_00);
        point_a = (undefined1  [8])((long)point_a + 0x90);
      } while (point_a != (undefined1  [8])pVVar28);
    }
  }
  pIVar29 = local_50;
  local_50->row_stride = (this->rasterizer).colorbuffer.row_stride;
  iVar10 = (this->rasterizer).colorbuffer.width_;
  local_50->height_ = (this->rasterizer).colorbuffer.height_;
  local_50->width_ = iVar10;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_50->data_,&(this->rasterizer).colorbuffer.data_);
  if (local_1b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b8,local_1a8 - (long)local_1b8);
  }
  if (local_198 != (void *)0x0) {
    operator_delete(local_198,(long)local_188 - (long)local_198);
  }
  return pIVar29;
}

Assistant:

core::Image4u render(const core::Mesh& mesh, const Eigen::Matrix4<T>& model_view_matrix,
                         const Eigen::Matrix4<T>& projection_matrix,
                         const cpp17::optional<Texture>& texture = cpp17::nullopt)
    {
        // The number of vertices has to be equal for both shape and colour, or, alternatively, it has to be a
        // shape-only model:
        assert(mesh.vertices.size() == mesh.colors.size() || mesh.colors.empty());
        // Make sure one of these three things is true:
        //  a) There are texture coordinates given for each vertex (the texture map doesn't contain any seams)
        //  b) A different number of tex coords and vertices (i.e. the texture map contains seams): A separate
        //     list of texture triangle indices has to be given (i.e. mesh.tti is not empty)
        //  c) There are no texture coordinates given (i.e. rendering without texture).
        assert(mesh.vertices.size() == mesh.texcoords.size() ||
               ((mesh.vertices.size() != mesh.texcoords.size()) && !mesh.tti.empty()) ||
               mesh.texcoords.empty());
        // Sanity check on the texture triangle indices: They should be either empty or equal to tvi.size():
        assert(mesh.tti.empty() || mesh.tti.size() == mesh.tvi.size());
        // Make sure either no texture is given, or a texture and texture coords:
        // (Potential todo: Is there a texturing flag we should check for too?)
        assert(!texture.has_value() || (texture.has_value() && mesh.texcoords.size() > 0));

        using detail::divide_by_w;
        using std::vector;

        vector<Eigen::Vector4<T>> clipspace_vertices;
        for (const auto& vertex_position : mesh.vertices)
        {
            // Note: We make an unnecessary copy of the vertex_position here. We could perhaps improve this by
            // using vertex_shader.operator()<vertex_type, T>(...). We're also making vertex_position the same
            // type as the matrix here, which we wouldn't necessarily need to, as VertexShader supports a
            // VertexType and MatrixType.
            clipspace_vertices.push_back(
                vertex_shader(Eigen::Vector4<T>(vertex_position.homogeneous()), model_view_matrix, projection_matrix));
            // Note: if mesh.colors.empty() (in case of shape-only model!), then the vertex colour is no
            // longer set to gray. But we don't want that here, maybe we only want texturing, then we don't
            // need vertex-colours at all. We can do it in a custom VertexShader if needed.
        }

        // All vertices are in clip-space now. Prepare the rasterisation stage:
        vector<Triangle<T>> triangles_to_raster;
        const auto& tti = mesh.tti.empty() ? mesh.tvi : mesh.tti; // If tti is not empty, we'll use it, otherwise,
                                                                  // use tvi for texturing.

        // In the loop further below, we're building a list of triangles to render, and will be indexing into
        // Mesh::colors. But that array is not available for meshes without per-vertex colouring. So we'll use
        // the below lambda which either returns the colours for the vertex, or an empty vector.
        const auto get_color_or_zero = [](const std::vector<Eigen::Vector3f>& mesh_colors, int vertex_index) {
            if (mesh_colors.size() > 0)
            {
                return mesh_colors[vertex_index];
            } else
            {
                return Eigen::Vector3f(0.0f, 0.0f, 0.0f);
            }
        };

        // This builds the (one and final) triangles to render. Meaning: The triangles formed of mesh.tvi (the
        // ones that survived the clip/culling), plus possibly more that intersect one of the frustum planes
        // (i.e. this can generate new triangles with new pos/vc/texcoords).
        for (std::size_t tri_index = 0; tri_index < mesh.tvi.size(); ++tri_index)
        {
            const auto& tri_indices = mesh.tvi[tri_index];
            const auto& tri_tc_indices = tti[tri_index];
            unsigned char visibility_bits[3];
            for (unsigned char k = 0; k < 3; k++)
            {
                visibility_bits[k] = 0;
                const auto x_cc = clipspace_vertices[tri_indices[k]].x();
                const auto y_cc = clipspace_vertices[tri_indices[k]].y();
                const auto z_cc = clipspace_vertices[tri_indices[k]].z();
                const auto w_cc = clipspace_vertices[tri_indices[k]].w();
                if (x_cc < -w_cc) // true if outside of view frustum. False if on or inside the plane.
                    visibility_bits[k] |= 1; // set bit if outside of frustum
                if (x_cc > w_cc)
                    visibility_bits[k] |= 2;
                if (y_cc < -w_cc)
                    visibility_bits[k] |= 4;
                if (y_cc > w_cc)
                    visibility_bits[k] |= 8;
                if (enable_near_clipping && z_cc < -w_cc) // near plane frustum clipping
                    visibility_bits[k] |= 16;
                if (rasterizer.enable_far_clipping && z_cc > w_cc) // far plane frustum clipping
                    visibility_bits[k] |= 32;
            } // if all bits are 0, then it's inside the frustum
            // all vertices are not visible - reject the triangle.
            if ((visibility_bits[0] & visibility_bits[1] & visibility_bits[2]) > 0)
            {
                continue;
            }
            // all vertices are visible - pass the whole triangle to the rasteriser. = All bits of all 3
            // triangles are 0.
            if ((visibility_bits[0] | visibility_bits[1] | visibility_bits[2]) == 0)
            {
                // relevant part of process_prospective_tri:
                std::array<Eigen::Vector4<T>, 3> prospective_tri{
                    divide_by_w(clipspace_vertices[tri_indices[0]]),
                    divide_by_w(clipspace_vertices[tri_indices[1]]),
                    divide_by_w(clipspace_vertices[tri_indices[2]])};
                // We have a prospective tri in NDC coords now, with its vertices having coords [x_ndc, y_ndc,
                // z_ndc, 1/w_clip].

                // Replaces x and y of the NDC coords with the screen coords. Keep z and w the same.
                const Eigen::Vector2<T> v0_screen =
                    clip_to_screen_space(prospective_tri[0].x(), prospective_tri[0].y(),
                                         rasterizer.viewport_width, rasterizer.viewport_height);
                prospective_tri[0].x() = v0_screen.x();
                prospective_tri[0].y() = v0_screen.y();
                const Eigen::Vector2<T> v1_screen =
                    clip_to_screen_space(prospective_tri[1].x(), prospective_tri[1].y(),
                                         rasterizer.viewport_width, rasterizer.viewport_height);
                prospective_tri[1].x() = v1_screen.x();
                prospective_tri[1].y() = v1_screen.y();
                const Eigen::Vector2<T> v2_screen =
                    clip_to_screen_space(prospective_tri[2].x(), prospective_tri[2].y(),
                                         rasterizer.viewport_width, rasterizer.viewport_height);
                prospective_tri[2].x() = v2_screen.x();
                prospective_tri[2].y() = v2_screen.y();

                // Culling (front/back/none - or what are OpenGL's modes?). Do we do any culling
                // elsewhere? No?
                if (enable_backface_culling)
                {
                    // Note/Todo: Isn't this just v0_screen, etc.? Let's assume for now it is. So before, we had here:
                    // prospective_tri[0], [1], [2], but we only need their x and y coords.
                    if (!detail::are_vertices_ccw_in_screen_space(
                            Eigen::Vector2<T>(prospective_tri[0].x(), prospective_tri[0].y()),
                            Eigen::Vector2<T>(prospective_tri[1].x(), prospective_tri[1].y()),
                            Eigen::Vector2<T>(prospective_tri[2].x(), prospective_tri[2].y())))
                        continue;
                }

                // Get the bounding box of the triangle:
                const auto boundingBox = detail::calculate_clipped_bounding_box(
                    Eigen::Vector2<T>(prospective_tri[0].x(), prospective_tri[0].y()),
                    Eigen::Vector2<T>(prospective_tri[1].x(), prospective_tri[1].y()),
                    Eigen::Vector2<T>(prospective_tri[2].x(), prospective_tri[2].y()),
                    rasterizer.viewport_width, rasterizer.viewport_height);
                const auto min_x = boundingBox.x;
                const auto max_x = boundingBox.x + boundingBox.width;
                const auto min_y = boundingBox.y;
                const auto max_y = boundingBox.y + boundingBox.height;
                if (max_x <= min_x || max_y <= min_y)
                { // Note: Can the width/height of the bbox be negative? Maybe we only need to check for
                    // equality here?
                    continue;
                }

                // If we're here, the triangle is CCW in screen space and the bbox is inside the viewport!
                triangles_to_raster.push_back(Triangle<T>{
                    detail::Vertex<T>{prospective_tri[0], get_color_or_zero(mesh.colors, tri_indices[0]),
                                         Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[0]](0),
                                                          mesh.texcoords[tri_tc_indices[0]](1))},
                    detail::Vertex<T>{prospective_tri[1], get_color_or_zero(mesh.colors, tri_indices[1]),
                                         Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[1]](0),
                                                          mesh.texcoords[tri_tc_indices[1]](1))},
                    detail::Vertex<T>{prospective_tri[2], get_color_or_zero(mesh.colors, tri_indices[2]),
                                         Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[2]](0),
                                                          mesh.texcoords[tri_tc_indices[2]](1))}});
                continue; // Triangle was either added or not added. Continue with next triangle.
            }
            // At this point, the triangle is known to be intersecting one of the view frustum's planes
            // Note: It seems that this is only w.r.t. the near-plane. If a triangle is partially outside the
            // tlbr viewport, it'll get rejected.
            // Well, 'z' of these triangles seems to be -1, so is that really the near plane?
            std::vector<detail::Vertex<T>> vertices;
            vertices.reserve(3);
            vertices.push_back(detail::Vertex<T>{clipspace_vertices[tri_indices[0]],
                                                    get_color_or_zero(mesh.colors, tri_indices[0]),
                                                 Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[0]](0),
                                                                     mesh.texcoords[tri_tc_indices[0]](1))});
            vertices.push_back(detail::Vertex<T>{clipspace_vertices[tri_indices[1]],
                                                    get_color_or_zero(mesh.colors, tri_indices[1]),
                                                 Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[1]](0),
                                                                     mesh.texcoords[tri_tc_indices[1]](1))});
            vertices.push_back(detail::Vertex<T>{clipspace_vertices[tri_indices[2]],
                                                    get_color_or_zero(mesh.colors, tri_indices[2]),
                                                 Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[2]](0),
                                                                     mesh.texcoords[tri_tc_indices[2]](1))});
            // split the triangle if it intersects the near plane:
            if (enable_near_clipping)
            {
                vertices = clip_polygon_to_plane_in_4d(
                    vertices, Eigen::Vector4<T>(T(0.0), T(0.0), T(-1.0),
                                               T(-1.0))); // "Normal" (or "4D hyperplane") of the near-plane.
                                                          // I tested it and it works like this but I'm a
                                                          // little bit unsure because Songho says the normal
                                                          // of the near-plane is (0,0,-1,1) (maybe I have to
                                                          // switch around the < 0 checks in the function?)
            }

            // Triangulation of the polygon formed of the 'vertices' array:
            if (vertices.size() >= 3)
            {
                for (unsigned char k = 0; k < vertices.size() - 2; k++)
                {
                    // Build a triangle from vertices[0], vertices[1 + k], vertices[2 + k]:
                    // Add to triangles_to_raster if it passed culling etc.
                    // TODO: This does the same as above - the code is copied 1:1. Avoid!
                    // COPY START (but init of prospective_tri is changed, as well as init of 't'.)
                    std::array<Eigen::Vector4<T>, 3> prospective_tri{divide_by_w(vertices[0].position),
                                                                    divide_by_w(vertices[1 + k].position),
                                                                    divide_by_w(vertices[2 + k].position)};

                    const Eigen::Vector2<T> v0_screen =
                        clip_to_screen_space(prospective_tri[0].x(), prospective_tri[0].y(),
                                             rasterizer.viewport_width, rasterizer.viewport_height);
                    prospective_tri[0].x() = v0_screen.x();
                    prospective_tri[0].y() = v0_screen.y();
                    const Eigen::Vector2<T> v1_screen =
                        clip_to_screen_space(prospective_tri[1].x(), prospective_tri[1].y(),
                                             rasterizer.viewport_width, rasterizer.viewport_height);
                    prospective_tri[1].x() = v1_screen.x();
                    prospective_tri[1].y() = v1_screen.y();
                    const Eigen::Vector2<T> v2_screen =
                        clip_to_screen_space(prospective_tri[2].x(), prospective_tri[2].y(),
                                             rasterizer.viewport_width, rasterizer.viewport_height);
                    prospective_tri[2].x() = v2_screen.x();
                    prospective_tri[2].y() = v2_screen.y();

                    if (enable_backface_culling)
                    {
                        if (!detail::are_vertices_ccw_in_screen_space(
                                Eigen::Vector2<T>(prospective_tri[0].x(), prospective_tri[0].y()),
                                Eigen::Vector2<T>(prospective_tri[1].x(), prospective_tri[1].y()),
                                Eigen::Vector2<T>(prospective_tri[2].x(), prospective_tri[2].y())))
                            continue;
                    }

                    const auto boundingBox = detail::calculate_clipped_bounding_box(
                        Eigen::Vector2<T>(prospective_tri[0].x(), prospective_tri[0].y()),
                        Eigen::Vector2<T>(prospective_tri[1].x(), prospective_tri[1].y()),
                        Eigen::Vector2<T>(prospective_tri[2].x(), prospective_tri[2].y()),
                        rasterizer.viewport_width, rasterizer.viewport_height);
                    const auto min_x = boundingBox.x;
                    const auto max_x = boundingBox.x + boundingBox.width;
                    const auto min_y = boundingBox.y;
                    const auto max_y = boundingBox.y + boundingBox.height;
                    if (max_x <= min_x || max_y <= min_y)
                    {
                        continue;
                    }

                    // If we're here, the triangle is CCW in screen space and the bbox is inside the viewport!
                    triangles_to_raster.push_back(Triangle<T>{
                        detail::Vertex<T>{prospective_tri[0], vertices[0].color, vertices[0].texcoords},
                        detail::Vertex<T>{prospective_tri[1], vertices[1 + k].color,
                                             vertices[1 + k].texcoords},
                        detail::Vertex<T>{prospective_tri[2], vertices[2 + k].color,
                                             vertices[2 + k].texcoords}});
                    // continue; // triangle was either added or not added. Continue with next triangle.
                    // COPY END
                }
            }

        } // end of loop over all triangles

        // Each triangle contains [x_screen, y_screen, z_ndc, 1/w_clip].
        // We may have more triangles than in the original mesh.

        // Raster each triangle and apply the fragment shader on each pixel:
        for (const auto& tri : triangles_to_raster)
        {
            rasterizer.raster_triangle(tri[0], tri[1], tri[2], texture);
        }
        return rasterizer.colorbuffer;
    }